

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O1

bool pop_up_ask_type_location
               (int old_left,int old_top,int old_width,int old_height,int left_control,
               int top_control,int width_control,int height_control,int *ask_left,int *ask_top,
               int *ask_width,int *ask_height)

{
  ostream *poVar1;
  
  if (am_sdebug) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"**** Ask user to type location ",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    std::ostream::flush();
  }
  if (left_control == 0x66) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Left (old=",10);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,old_left);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,ask_left);
  }
  if (top_control == 0x66) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Top (old=",9);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,old_top);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,ask_top);
  }
  if (width_control == 0x66) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Width (old=",0xb);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,old_width);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,ask_width);
  }
  if (height_control == 0x66) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Height (old=",0xc);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,old_height);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,ask_height);
  }
  return true;
}

Assistant:

bool
pop_up_ask_type_location(int old_left, int old_top, int old_width,
                         int old_height, int left_control, int top_control,
                         int width_control, int height_control, int &ask_left,
                         int &ask_top, int &ask_width, int &ask_height)
{
  if (am_sdebug)
    std::cout << "**** Ask user to type location " << std::endl << std::flush;
  //** if value typed is a list, then just use the next value next time **//
  if (left_control == am_ask_user_type) {
    std::cout << "Left (old=" << old_left << "): " << std::flush;
    std::cin >> ask_left;
  }
  if (top_control == am_ask_user_type) {
    std::cout << "Top (old=" << old_top << "): " << std::flush;
    std::cin >> ask_top;
  }
  if (width_control == am_ask_user_type) {
    std::cout << "Width (old=" << old_width << "): " << std::flush;
    std::cin >> ask_width;
  }
  if (height_control == am_ask_user_type) {
    std::cout << "Height (old=" << old_height << "): " << std::flush;
    std::cin >> ask_height;
  }

  return true;
}